

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O3

int __thiscall QTemporaryFileEngine::remove(QTemporaryFileEngine *this,char *__filename)

{
  QFSFileEnginePrivate *this_00;
  int iVar1;
  int iVar2;
  undefined8 unaff_RBX;
  
  this_00 = (QFSFileEnginePrivate *)(this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d;
  QFSFileEnginePrivate::unmapAll(this_00);
  QFSFileEngine::close(&this->super_QFSFileEngine,(int)__filename);
  iVar2 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if (this->unnamedFile == false) {
    if ((this->filePathIsTemplate == false) &&
       (iVar1 = QFSFileEngine::remove(&this->super_QFSFileEngine,__filename), (char)iVar1 != '\0'))
    {
      QFileSystemEntry::clear(&this_00->fileEntry);
      this->filePathIsTemplate = this->filePathWasTemplate;
      return iVar2;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

bool QTemporaryFileEngine::remove()
{
    Q_D(QFSFileEngine);
    // Since the QTemporaryFileEngine::close() does not really close the file,
    // we must explicitly call QFSFileEngine::close() before we remove it.
    d->unmapAll();
    QFSFileEngine::close();
    if (isUnnamedFile())
        return true;
    if (!filePathIsTemplate && QFSFileEngine::remove()) {
        d->fileEntry.clear();
        // If a QTemporaryFile is constructed using a template file path, the path
        // is generated in QTemporaryFileEngine::open() and then filePathIsTemplate
        // is set to false. If remove() and then open() are called on the same
        // QTemporaryFile, the path is not regenerated. Here we ensure that if the
        // file path was generated, it will be generated again in the scenario above.
        filePathIsTemplate = filePathWasTemplate;
        return true;
    }
    return false;
}